

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteKvIoPageDontMakeHot(unqlite_page *pRaw)

{
  uchar *puVar1;
  Pager *pPager;
  Page *pPage;
  unqlite_page *pRaw_local;
  
  if ((pRaw != (unqlite_page *)0x0) &&
     (*(uint *)&pRaw[1].pUserData = *(uint *)&pRaw[1].pUserData | 0x80,
     ((ulong)pRaw[1].pUserData & 0x40) != 0)) {
    puVar1 = pRaw[1].zData;
    if (pRaw[3].iPage != 0) {
      *(uchar **)(pRaw[3].iPage + 0x60) = pRaw[4].zData;
    }
    if (pRaw[4].zData != (uchar *)0x0) {
      *(pgno *)(pRaw[4].zData + 0x58) = pRaw[3].iPage;
    }
    if (*(unqlite_page **)(puVar1 + 0x238) == pRaw) {
      *(uchar **)(puVar1 + 0x238) = pRaw[4].zData;
    }
    if (*(unqlite_page **)(puVar1 + 0x230) == pRaw) {
      *(pgno *)(puVar1 + 0x230) = pRaw[3].iPage;
    }
    *(int *)(puVar1 + 0x240) = *(int *)(puVar1 + 0x240) + -1;
    *(uint *)&pRaw[1].pUserData = *(uint *)&pRaw[1].pUserData & 0xffffffbf;
  }
  return 0;
}

Assistant:

static int unqliteKvIoPageDontMakeHot(unqlite_page *pRaw)
{
	Page *pPage = (Page *)pRaw;
	
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	pPage->flags |= PAGE_DONT_MAKE_HOT;

	/* Remove from hot dirty list if it is already there */
	if( pPage->flags & PAGE_HOT_DIRTY ){
		Pager *pPager = pPage->pPager;
		if( pPage->pNextHot ){
			pPage->pNextHot->pPrevHot = pPage->pPrevHot;
		}
		if( pPage->pPrevHot ){
			pPage->pPrevHot->pNextHot = pPage->pNextHot;
		}
		if( pPager->pFirstHot == pPage ){
			pPager->pFirstHot = pPage->pPrevHot;
		}
		if( pPager->pHotDirty == pPage ){
			pPager->pHotDirty = pPage->pNextHot;
		}
		pPager->nHot--;
		pPage->flags &= ~PAGE_HOT_DIRTY;
	}

	return UNQLITE_OK;
}